

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# os_stdio.cpp
# Opt level: O2

int os_gets_timeout(uchar *buf,size_t bufl,unsigned_long timeout_in_milliseconds,int use_timeout)

{
  uchar *puVar1;
  
  if (use_timeout != 0) {
    return 4;
  }
  puVar1 = os_gets(buf,bufl);
  return 6 - (uint)(puVar1 == (uchar *)0x0);
}

Assistant:

int os_gets_timeout(unsigned char *buf, size_t bufl,
                    unsigned long timeout_in_milliseconds, int use_timeout)
{
    /* 
     *   if we've been asked to read with a timeout, we can't comply, so
     *   just return the no-timeout-available error code; if we're reading
     *   without a timeout, just use the ordinary input reader 
     */
    if (use_timeout)
    {
        /* timeout requested, no can do - return the no-timeout error code */
        return OS_EVT_NOTIMEOUT;
    }
    else
    {
        /* 
         *   no timeout requested, so use the ordinary reader, and translate
         *   its returns codes to the appropriate equivalents for this
         *   routine (null from os_gets -> error -> OS_EVT_EOF as our return
         *   code; non-null -> success -> OS_EVT_LINE) 
         */
        return (os_gets(buf, bufl) == 0 ? OS_EVT_EOF : OS_EVT_LINE);
    }
}